

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_set.c
# Opt level: O2

int mpt_command_set(mpt_array *arr,uintptr_t id,_func_int_void_ptr_void_ptr *cmd,void *arg)

{
  mpt_command *pmVar1;
  mpt_buffer *pmVar2;
  mpt_type_traits *pmVar3;
  uintptr_t *puVar4;
  ulong pos;
  
  pmVar1 = mpt_command_get(arr,id);
  if (pmVar1 != (mpt_command *)0x0) {
    (*pmVar1->cmd)(pmVar1->arg,(void *)0x0);
    pmVar1->cmd = cmd;
    pmVar1->arg = arg;
    return (uint)(cmd == (_func_int_void_ptr_void_ptr *)0x0) * 2;
  }
  pmVar2 = arr->_buf;
  if (pmVar2 == (mpt_buffer *)0x0) {
    pmVar2 = _mpt_buffer_alloc(0x18,2);
    if (pmVar2 == (mpt_buffer *)0x0) {
      return -4;
    }
    pmVar3 = mpt_command_traits();
    pmVar2->_content_traits = pmVar3;
    arr->_buf = pmVar2;
    puVar4 = (uintptr_t *)mpt_buffer_insert(pmVar2,0,0x18);
    if (puVar4 == (uintptr_t *)0x0) {
      return -4;
    }
  }
  else {
    pos = pmVar2->_used;
    if (0x17 < pos) {
      pmVar1 = mpt_command_empty((mpt_command *)(pmVar2 + 1),pos / 0x18);
      if (pmVar1 != (mpt_command *)0x0) {
        pmVar1->id = id;
        pmVar1->cmd = cmd;
        pmVar1->arg = arg;
        return 0;
      }
      pos = pmVar2->_used;
    }
    puVar4 = (uintptr_t *)mpt_array_insert(arr,pos,0x18);
    if (puVar4 == (uintptr_t *)0x0) {
      return -4;
    }
  }
  *puVar4 = id;
  puVar4[1] = (uintptr_t)cmd;
  puVar4[2] = (uintptr_t)arg;
  return 1;
}

Assistant:

extern int mpt_command_set(_MPT_UARRAY_TYPE(command) *arr, uintptr_t id, int (*cmd)(void *, void *), void *arg)
{
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(command) *dest;
	
	/* replace/delete command */
	if ((dest = mpt_command_get(arr, id))) {
		dest->cmd(dest->arg, 0);
		dest->cmd = cmd;
		dest->arg = arg;
		return cmd ? 0 : 2;
	}
	if (!(buf = arr->_buf)) {
		/* reject copy (command has singular context reference!) */
		if (!(buf = _mpt_buffer_alloc(sizeof(*dest), MPT_ENUM(BufferNoCopy)))) {
			return MPT_ERROR(BadOperation);
		}
		buf->_content_traits = mpt_command_traits();
		arr->_buf = buf;
		if (!(dest = mpt_buffer_insert(buf, 0, sizeof(*dest)))) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		size_t len = buf->_used / sizeof(*dest);
		
		/* place in empty area */
		if (len && (dest = mpt_command_empty((void *) (buf + 1), len))) {
			dest->id = id;
			dest->cmd = cmd;
			dest->arg = arg;
			return 0;
		}
		/* append command data */
		if (!(dest = mpt_array_insert(arr, buf->_used, sizeof(*dest)))) {
			return MPT_ERROR(BadOperation);
		}
	}
	dest->id = id;
	dest->cmd = cmd;
	dest->arg = arg;
	
	return 1;
}